

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutengine.cpp
# Opt level: O0

QSize qSmartMinSize(QWidgetItem *i)

{
  long lVar1;
  QSizePolicy QVar2;
  QSizePolicy *sizePolicy;
  QSize QVar3;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  QWidget *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sizePolicy = (QSizePolicy *)(**(code **)(*(long *)in_RDI + 0x68))();
  (**(code **)(*(long *)sizePolicy + 0x70))();
  (**(code **)(*(long *)sizePolicy + 0x78))();
  QWidget::minimumSize(in_RDI);
  QVar3 = QWidget::maximumSize(in_RDI);
  QVar2 = QWidget::sizePolicy(in_stack_ffffffffffffffb0);
  QVar3 = qSmartMinSize((QSize *)QVar3,(QSize *)CONCAT44(QVar2.field_0,in_stack_ffffffffffffffd0),
                        (QSize *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                        (QSize *)in_RDI,sizePolicy);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

Q_WIDGETS_EXPORT QSize qSmartMinSize(const QWidgetItem *i)
{
    QWidget *w = i->widget();
    return qSmartMinSize(w->sizeHint(), w->minimumSizeHint(),
                            w->minimumSize(), w->maximumSize(),
                            w->sizePolicy());
}